

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_advance_to_peeked(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  undefined1 uVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  ro_substr chars;
  char msg [77];
  char local_58 [72];
  undefined4 local_10;
  undefined1 local_c;
  
  bVar9 = 0;
  _line_progressed(this,(this->m_state->line_contents).rem.len);
  _line_ended(this);
  chars.len = 2;
  chars.str = "\r\n";
  sVar5 = basic_substring<const_char>::first_of(&(this->m_state->line_contents).rem,chars,0);
  if (sVar5 != 0xffffffffffffffff) {
    pcVar7 = "check failed: (m_state->line_contents.rem.first_of(\"\\r\\n\") == csubstr::npos)";
    pcVar8 = local_58;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + ((ulong)bVar9 * -2 + 1) * 8;
    }
    local_c = 0;
    local_10 = 0x29736f70;
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        uVar4 = (*pcVar1)();
        return (bool)uVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x763c) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x763c) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_58,0x4d,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  _scan_line(this);
  return (this->m_state->pos).super_LineCol.offset < (this->m_buf).len;
}

Assistant:

bool Parser::_advance_to_peeked()
{
    _line_progressed(m_state->line_contents.rem.len);
    _line_ended(); // advances to the peeked-at line, consuming all remaining (probably newline) characters on the current line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.first_of("\r\n") == csubstr::npos);
    _c4dbgpf("advance to peeked: scan more... pos={} len={}", m_state->pos.offset, m_buf.len);
    _scan_line();  // puts the peeked-at line in the buffer
    if(_finished_file())
    {
        _c4dbgp("rscalar: finished file!");
        return false;
    }
    return true;
}